

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void scqf(int nt,double *t,int *mlt,double *wts,int param_5,int *ndx,double *swts,double *st,
         int kind,double alpha,double beta,double a,double b)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double local_a0;
  double tmp;
  double temp;
  double slp;
  double shft;
  double p;
  int local_70;
  int l;
  int k;
  int i;
  double be;
  double al;
  double b_local;
  double a_local;
  double beta_local;
  double alpha_local;
  int *ndx_local;
  int param_4_local;
  double *wts_local;
  int *mlt_local;
  double *t_local;
  int nt_local;
  
  be = 0.0;
  _k = 0.0;
  slp = 0.0;
  temp = 0.0;
  dVar2 = r8_epsilon();
  parchk(kind,1,alpha,beta);
  if (kind == 1) {
    be = 0.0;
    _k = 0.0;
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
  }
  else if (kind == 2) {
    be = -0.5;
    _k = -0.5;
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
  }
  else if (kind == 3) {
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
    _k = alpha;
    be = alpha;
  }
  else if (kind == 4) {
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
    _k = beta;
    be = alpha;
  }
  else if (kind == 5) {
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  B <= 0\n");
      exit(1);
    }
    temp = 1.0 / b;
    _k = 0.0;
    slp = a;
    be = alpha;
  }
  else if (kind == 6) {
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  B <= 0.\n");
      exit(1);
    }
    dVar2 = sqrt(b);
    temp = 1.0 / dVar2;
    _k = 0.0;
    slp = a;
    be = alpha;
  }
  else if (kind == 7) {
    _k = 0.0;
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
    be = alpha;
  }
  else if (kind == 8) {
    if (a + b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  A + B <= 0.\n");
      exit(1);
    }
    temp = a + b;
    slp = a;
    _k = beta;
    be = alpha;
  }
  else if (kind == 9) {
    be = 0.5;
    _k = 0.5;
    dVar3 = r8_abs(b - a);
    if (dVar3 <= dVar2) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      std::operator<<((ostream *)&std::cerr,"  |B - A| too small.\n");
      exit(1);
    }
    slp = (a + b) / 2.0;
    temp = (b - a) / 2.0;
  }
  dVar2 = pow(temp,be + _k + 1.0);
  for (local_70 = 0; local_70 < nt; local_70 = local_70 + 1) {
    st[local_70] = temp * t[local_70] + slp;
    iVar1 = ndx[local_70];
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (iVar1 != 0) {
      local_a0 = dVar2;
      for (l = iVar1 + -1; l <= iVar1 + mlt[local_70] + -2; l = l + 1) {
        swts[l] = wts[l] * local_a0;
        local_a0 = local_a0 * temp;
      }
    }
  }
  return;
}

Assistant:

void scqf ( int nt, double t[], int mlt[], double wts[], int /*nwts*/, int ndx[], 
  double swts[], double st[], int kind, double alpha, double beta, double a, 
  double b )

//****************************************************************************80
//
//  Purpose:
//
//    SCQF scales a quadrature formula to a nonstandard interval.
//
//  Discussion:
//
//    The arrays WTS and SWTS may coincide.
//
//    The arrays T and ST may coincide.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int NT, the number of knots.
//
//    Input, double T[NT], the original knots.
//
//    Input, int MLT[NT], the multiplicity of the knots.
//
//    Input, double WTS[NWTS], the weights.
//
//    Input, int NWTS, the number of weights.
//
//    Input, int NDX[NT], used to index the array WTS.  
//    For more details see the comments in CAWIQ.
//
//    Output, double SWTS[NWTS], the scaled weights.
//
//    Output, double ST[NT], the scaled knots.
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Input, double A, B, the interval endpoints.
//
{
  double al = 0.0; // Silence uninitialized warning.
  double be = 0.0; // Silence uninitialized warning.
  int i;
  int k;
  int l;
  double p;
  double shft = 0.0; // Silence uninitialized warning.
  double slp = 0.0; // Silence uninitialized warning.
  double temp;
  double tmp;

  temp = r8_epsilon ( );

  parchk ( kind, 1, alpha, beta );

  if ( kind == 1 )
  {
    al = 0.0;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 2 )
  {
    al = -0.5;
    be = -0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 3 )
  {
    al = alpha;
    be = alpha;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 4 )
  {
    al = alpha;
    be = beta;

    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 5 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / b;
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 6 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / sqrt ( b );
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 7 )
  {
    al = alpha;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 8 )
  {
    if ( a + b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  A + B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = a + b;
    al = alpha;
    be = beta;
  }
  else if ( kind == 9 )
  {
    al = 0.5;
    be = 0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }

  p = pow ( slp, al + be + 1.0 );

  for ( k = 0; k < nt; k++ )
  {
    st[k] = shft + slp * t[k];
    l = abs ( ndx[k] );

    if ( l != 0 )
    {
      tmp = p;
      for ( i = l - 1; i <= l - 1 + mlt[k] - 1; i++ )
      {
        swts[i] = wts[i] * tmp;
        tmp = tmp * slp;
      }
    }
  }
  return;
}